

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O0

void readGZ1(char *fileName,Array2D<Imath_3_2::half> *rPixels,Array2D<Imath_3_2::half> *gPixels,
            Array2D<float> *zPixels,int *width,int *height)

{
  int iVar1;
  half *phVar2;
  float *pfVar3;
  ulong uVar4;
  Array2D<float> *in_RCX;
  Array2D<Imath_3_2::half> *in_RDX;
  Array2D<Imath_3_2::half> *in_RSI;
  char *in_RDI;
  int *in_R8;
  _Base_ptr in_R9;
  float fVar5;
  FrameBuffer frameBuffer;
  Box2i dw;
  InputFile file;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe64;
  long in_stack_fffffffffffffe70;
  long in_stack_fffffffffffffe78;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffe80;
  Slice local_148 [56];
  Slice local_110 [56];
  Slice local_d8 [56];
  char local_a0 [64];
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  FrameBuffer local_50;
  Array2D<float> *local_20;
  Array2D<Imath_3_2::half> *local_18;
  Array2D<Imath_3_2::half> *local_10;
  
  local_50._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = in_R9;
  local_50._map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&local_50,in_RDI,iVar1);
  Imf_3_4::InputFile::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  *(int *)local_50._map._M_t._M_impl.super__Rb_tree_header._M_node_count = (local_58 - local_60) + 1
  ;
  (local_50._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color =
       (local_54 - local_5c) + _S_black;
  Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  Imf_3_4::Array2D<float>::resizeErase
            ((Array2D<float> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             in_stack_fffffffffffffe70);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x10c9ca);
  phVar2 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](local_10,0);
  Imf_3_4::Slice::Slice
            (local_d8,HALF,
             (char *)(phVar2 + (-(long)local_60 -
                               (long)(local_5c *
                                     *(int *)local_50._map._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count))),2,
             (long)*(int *)local_50._map._M_t._M_impl.super__Rb_tree_header._M_node_count * 2,1,1,
             0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_a0,(Slice *)"R");
  phVar2 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](local_18,0);
  Imf_3_4::Slice::Slice
            (local_110,HALF,
             (char *)(phVar2 + (-(long)local_60 -
                               (long)(local_5c *
                                     *(int *)local_50._map._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count))),2,
             (long)*(int *)local_50._map._M_t._M_impl.super__Rb_tree_header._M_node_count * 2,1,1,
             0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_a0,(Slice *)"G");
  pfVar3 = Imf_3_4::Array2D<float>::operator[](local_20,0);
  pfVar3 = pfVar3 + (-(long)local_60 -
                    (long)(local_5c *
                          *(int *)local_50._map._M_t._M_impl.super__Rb_tree_header._M_node_count));
  uVar4 = (long)*(int *)local_50._map._M_t._M_impl.super__Rb_tree_header._M_node_count << 2;
  fVar5 = std::numeric_limits<float>::max();
  uVar6 = 0;
  Imf_3_4::Slice::Slice(local_148,FLOAT,(char *)pfVar3,4,uVar4,1,1,(double)fVar5,false,false);
  Imf_3_4::FrameBuffer::insert(local_a0,(Slice *)0x1206a1);
  Imf_3_4::InputFile::setFrameBuffer(&local_50);
  Imf_3_4::InputFile::readPixels((int)&local_50,local_5c);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x10cc0d);
  Imf_3_4::InputFile::~InputFile((InputFile *)CONCAT44(in_stack_fffffffffffffe64,uVar6));
  return;
}

Assistant:

void
readGZ1 (
    const char      fileName[],
    Array2D<half>&  rPixels,
    Array2D<half>&  gPixels,
    Array2D<float>& zPixels,
    int&            width,
    int&            height)
{
    //
    // Read an image using class InputFile.  Try to read two
    // channels, R and G, of type HALF, and one channel, Z,
    // of type FLOAT.  Store the R, G, and Z pixels in three
    // separate memory buffers.
    // If a channel is missing in the file, the buffer for that
    // channel will be filled with an appropriate default value.
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the layout of the R, G, and Z pixel buffers
    //	- read the pixels from the file
    //

    InputFile file (fileName);

    Box2i dw = file.header ().dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;

    rPixels.resizeErase (height, width);
    gPixels.resizeErase (height, width);
    zPixels.resizeErase (height, width);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "R", // name
        Slice (
            IMF::HALF,                // type
            (char*) (&rPixels[0][0] - // base
                     dw.min.x - dw.min.y * width),
            sizeof (rPixels[0][0]) * 1,     // xStride
            sizeof (rPixels[0][0]) * width, // yStride
            1,
            1,     // x/y sampling
            0.0)); // fillValue

    frameBuffer.insert (
        "G", // name
        Slice (
            IMF::HALF,                // type
            (char*) (&gPixels[0][0] - // base
                     dw.min.x - dw.min.y * width),
            sizeof (gPixels[0][0]) * 1,     // xStride
            sizeof (gPixels[0][0]) * width, // yStride
            1,
            1,     // x/y sampling
            0.0)); // fillValue

    frameBuffer.insert (
        "Z", // name
        Slice (
            IMF::FLOAT,               // type
            (char*) (&zPixels[0][0] - // base
                     dw.min.x - dw.min.y * width),
            sizeof (zPixels[0][0]) * 1,     // xStride
            sizeof (zPixels[0][0]) * width, // yStride
            1,
            1,                                    // x/y sampling
            std::numeric_limits<float>::max ())); // fillValue

    file.setFrameBuffer (frameBuffer);
    file.readPixels (dw.min.y, dw.max.y);
}